

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManAssignAdjacency(Iso_Man_t *p)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  void **ppvVar10;
  uint uVar11;
  Iso_Obj_t *pIVar12;
  long lVar13;
  Iso_Obj_t *pIVar14;
  long lVar15;
  
  pAVar1 = p->pAig;
  pVVar2 = pAVar1->vObjs;
  iVar5 = pVVar2->nSize;
  lVar6 = (long)iVar5;
  if (0 < lVar6) {
    ppvVar10 = pVVar2->pArray;
    lVar13 = 0;
    do {
      pvVar3 = *ppvVar10;
      if (pvVar3 != (void *)0x0) {
        pIVar12 = p->pObjs;
        *(undefined8 *)((long)&pIVar12->FaninSig + lVar13) = 0;
        uVar8 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if (((uVar8 & 7) != 3) && (0xfffffffd < (uVar8 & 7) - 7)) {
          uVar7 = *(ulong *)((long)pvVar3 + 8);
          if (uVar7 == 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = (long)*(int *)((uVar7 & 0xfffffffffffffffe) + 0x24);
          }
          uVar8 = pIVar12[lVar15].FaninSig;
          *(uint *)((long)&pIVar12->FaninSig + lVar13) = uVar8;
          uVar11 = pIVar12[lVar15].Id;
          if (uVar11 != 0) {
            if ((int)uVar11 < 0) goto LAB_00630009;
            uVar8 = uVar8 + uVar11 * s_1kPrimes[((uint)uVar7 & 1) + (uVar11 & 0x1ff) * 2];
            *(uint *)((long)&pIVar12->FaninSig + lVar13) = uVar8;
          }
          uVar7 = *(ulong *)((long)pvVar3 + 0x10);
          if (uVar7 == 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = (long)*(int *)((uVar7 & 0xfffffffffffffffe) + 0x24);
          }
          iVar9 = uVar8 + pIVar12[lVar15].FaninSig;
          *(int *)((long)&pIVar12->FaninSig + lVar13) = iVar9;
          uVar8 = pIVar12[lVar15].Id;
          if (uVar8 != 0) {
            if ((int)uVar8 < 0) goto LAB_00630009;
            *(uint *)((long)&pIVar12->FaninSig + lVar13) =
                 uVar8 * s_1kPrimes[((uint)uVar7 & 1) + (uVar8 & 0x1ff) * 2] + iVar9;
          }
        }
      }
      ppvVar10 = ppvVar10 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar6 * 0x18 != lVar13);
    if (0 < iVar5) {
      ppvVar10 = pVVar2->pArray;
      lVar13 = lVar6 * 3 + -2;
      uVar7 = lVar6 + 1;
      do {
        pvVar3 = ppvVar10[uVar7 - 2];
        if (pvVar3 != (void *)0x0) {
          uVar11 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
          uVar8 = uVar11 & 7;
          if (uVar8 != 2) {
            if (((ulong)pvVar3 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar8 != 1) {
              pIVar12 = p->pObjs;
              if (uVar8 == 3) {
                if ((&pIVar12->iNext)[lVar13 * 2] != 0) {
                  __assert_fail("!Aig_ObjIsCo(pObj) || pIso->Id == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                                ,0x317,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
                }
                if (*(ulong *)((long)pvVar3 + 8) == 0) {
                  lVar6 = -1;
                }
                else {
                  lVar6 = (long)*(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24)
                  ;
                }
                pIVar12[lVar6].FanoutSig =
                     pIVar12[lVar6].FanoutSig + *(int *)(&pIVar12->field_0x0 + lVar13 * 8);
              }
              else if (0xfffffffd < (uVar11 & 7) - 7) {
                uVar4 = *(ulong *)((long)pvVar3 + 8);
                if (uVar4 == 0) {
                  lVar6 = -1;
                }
                else {
                  lVar6 = (long)*(int *)((uVar4 & 0xfffffffffffffffe) + 0x24);
                }
                uVar11 = pIVar12[lVar6].FanoutSig + *(int *)(&pIVar12->field_0x0 + lVar13 * 8);
                pIVar12[lVar6].FanoutSig = uVar11;
                uVar8 = (&pIVar12->iNext)[lVar13 * 2];
                if (uVar8 != 0) {
                  if ((int)uVar8 < 0) goto LAB_00630009;
                  pIVar12[lVar6].FanoutSig =
                       s_1kPrimes[((uint)uVar4 & 1) + (uVar8 & 0x1ff) * 2] * uVar8 + uVar11;
                }
                uVar4 = *(ulong *)((long)pvVar3 + 0x10);
                if (uVar4 == 0) {
                  lVar6 = -1;
                }
                else {
                  lVar6 = (long)*(int *)((uVar4 & 0xfffffffffffffffe) + 0x24);
                }
                uVar11 = pIVar12[lVar6].FanoutSig + *(int *)(&pIVar12->field_0x0 + lVar13 * 8);
                pIVar12[lVar6].FanoutSig = uVar11;
                if (uVar8 != 0) {
                  pIVar12[lVar6].FanoutSig =
                       uVar8 * s_1kPrimes[((uint)uVar4 & 1) + (uVar8 & 0x1ff) * 2] + uVar11;
                }
              }
            }
          }
        }
        uVar7 = uVar7 - 1;
        lVar13 = lVar13 + -3;
      } while (1 < uVar7);
    }
  }
  if (0 < pAVar1->nRegs) {
    pVVar2 = pAVar1->vCos;
    iVar5 = -pAVar1->nRegs;
    do {
      uVar8 = pAVar1->nObjs[3] + iVar5;
      if (((((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) ||
          (uVar11 = pAVar1->nObjs[2] + iVar5, (int)uVar11 < 0)) ||
         (pAVar1->vCis->nSize <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar7 = *(ulong *)((long)pVVar2->pArray[uVar8] + 8);
      if ((uVar7 == 0) || (*(int *)((uVar7 & 0xfffffffffffffffe) + 0x24) != 0)) {
        iVar9 = *(int *)((long)pAVar1->vCis->pArray[uVar11] + 0x24);
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_0062ffea:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                        ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
        }
        if (iVar9 == 0) {
          pIVar12 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar12 = p->pObjs + iVar9;
        }
        if (uVar7 == 0) goto LAB_0062ffea;
        uVar8 = *(uint *)((uVar7 & 0xfffffffffffffffe) + 0x24);
        if (((long)(int)uVar8 < 0) || ((uint)p->nObjs <= uVar8)) goto LAB_0062ffea;
        if (uVar8 == 0) {
          pIVar14 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar14 = p->pObjs + (int)uVar8;
        }
        if (pIVar12->FaninSig != 0) {
          __assert_fail("pIso->FaninSig == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                        ,0x34d,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
        }
        uVar8 = pIVar14->FaninSig;
        pIVar12->FaninSig = uVar8;
        uVar11 = pIVar14->Id;
        if (uVar11 != 0) {
          if ((int)uVar11 < 0) {
LAB_00630009:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          pIVar12->FaninSig = uVar11 * s_1kPrimes[((uint)uVar7 & 1) + (uVar11 & 0x1ff) * 2] + uVar8;
        }
        uVar11 = pIVar14->FanoutSig + pIVar12->FanoutSig;
        pIVar14->FanoutSig = uVar11;
        uVar8 = pIVar12->Id;
        if (uVar8 != 0) {
          if ((int)uVar8 < 0) goto LAB_00630009;
          pIVar14->FanoutSig = uVar8 * s_1kPrimes[((uint)uVar7 & 1) + (uVar8 & 0x1ff) * 2] + uVar11;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void Iso_ManAssignAdjacency( Iso_Man_t * p )
{
    int fUseXor = 0;
    Iso_Obj_t * pIso, * pIsoF;
    Aig_Obj_t * pObj, * pObjLi;
    int i;

    // create TFI signatures
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        pIso = p->pObjs + i;
        pIso->FaninSig = 0;
        pIso->FanoutSig = 0;

        if ( Aig_ObjIsCo(pObj) )
            continue;
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
    }
    // create TFO signatures
    Aig_ManForEachObjReverse( p->pAig, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
            continue;
        pIso = p->pObjs + i;
        assert( !Aig_ObjIsCo(pObj) || pIso->Id == 0 );
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
    }

    // consider flops
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObj, i )
    {
        if ( Aig_ObjFaninId0(pObjLi) == 0 ) // ignore constant!
            continue;
        pIso  = Iso_ManObj( p, Aig_ObjId(pObj) );
        pIsoF = Iso_ManObj( p, Aig_ObjFaninId0(pObjLi) );
        assert( pIso->FaninSig == 0 );
//        assert( pIsoF->FanoutSig == 0 );

        if ( fUseXor )
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
        else
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
    }
}